

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Builder::Builder
          (Builder *this,shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *buffer)

{
  element_type *peVar1;
  char *msg;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *in_stack_ffffffffffffffa8;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_ffffffffffffffb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ExceptionType type;
  Exception *this_01;
  size_type in_stack_ffffffffffffffd8;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_ffffffffffffffe0;
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL> local_18 [3];
  
  std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::shared_ptr
            ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  peVar1 = std::
           __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
           get(in_RDI);
  in_RDI[1]._M_ptr = peVar1;
  in_RDI[1]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI[2]._M_ptr = (element_type *)0x0;
  this_00 = &in_RDI[2]._M_refcount;
  arena<64UL,_8UL>::arena((arena<64UL,_8UL> *)this_00);
  type = (ExceptionType)((ulong)this_00 >> 0x20);
  this_01 = (Exception *)(in_RDI + 7);
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>::short_alloc
            (local_18,(arena_type *)&in_RDI[2]._M_refcount);
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::vector(in_stack_ffffffffffffffb0,(allocator_type *)in_stack_ffffffffffffffa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1084a2);
  *(undefined1 *)&in_RDI[10]._M_refcount._M_pi = 0;
  in_RDI[0xb]._M_ptr = (element_type *)&Options::Defaults;
  if (in_RDI[1]._M_ptr != (element_type *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             Buffer<unsigned_char>::data(in_RDI[1]._M_ptr);
    in_RDI[1]._M_refcount._M_pi = p_Var2;
    peVar1 = (element_type *)Buffer<unsigned_char>::size(in_RDI[1]._M_ptr);
    in_RDI[2]._M_ptr = peVar1;
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::reserve(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    return;
  }
  msg = (char *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_01,type,msg);
  __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder::Builder(std::shared_ptr<Buffer<uint8_t>> buffer)
    : _buffer(std::move(buffer)),
      _bufferPtr(_buffer.get()),
      _start(nullptr),
      _pos(0),
      _arena(),
      _stack(_arena),
      _keyWritten(false),
      options(&Options::Defaults) {
  if (VELOCYPACK_UNLIKELY(_bufferPtr == nullptr)) {
    throw Exception(Exception::InternalError, "Buffer cannot be a nullptr");
  }
  _start = _bufferPtr->data();
  _pos = _bufferPtr->size();

  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
}